

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

char __thiscall smf::Options::getChar(Options *this,string *optionName)

{
  char cVar1;
  char *pcVar2;
  string local_38;
  string *local_18;
  string *optionName_local;
  Options *this_local;
  
  local_18 = optionName;
  optionName_local = (string *)this;
  getString(&local_38,this,optionName);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cVar1 = *pcVar2;
  std::__cxx11::string::~string((string *)&local_38);
  return cVar1;
}

Assistant:

char Options::getChar(const std::string& optionName) {
	return getString(optionName).c_str()[0];
}